

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dom.cpp
# Opt level: O0

string * __thiscall
crawler::ElementData::clazz_abi_cxx11_(string *__return_storage_ptr__,ElementData *this)

{
  allocator<char> local_39;
  string local_38;
  ElementData *local_18;
  ElementData *this_local;
  
  local_18 = this;
  this_local = (ElementData *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"class",&local_39);
  getValueByKey(__return_storage_ptr__,this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return __return_storage_ptr__;
}

Assistant:

std::string crawler::ElementData::clazz() const {
  return getValueByKey("class");
}